

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_scwp(DisasContext_conflict6 *ctx,uint32_t base,int16_t offset,uint32_t reg1,uint32_t reg2,
             _Bool eva)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 addr;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i64 retv;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGLabel *l;
  TCGLabel *l_00;
  int local_a4;
  TCGLabel *lab_done;
  TCGLabel *lab_fail;
  TCGv_i64 tmp2;
  TCGv_i64 tmp1;
  TCGv_i64 val;
  TCGv_i64 llval;
  TCGv_i64 tval;
  TCGv_i64 lladdr;
  TCGv_i64 taddr;
  TCGContext_conflict6 *tcg_ctx;
  _Bool eva_local;
  uint32_t reg2_local;
  uint32_t reg1_local;
  int16_t offset_local;
  uint32_t base_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  addr = tcg_temp_local_new_i64(tcg_ctx_00);
  ret = tcg_temp_local_new_i64(tcg_ctx_00);
  ret_00 = tcg_temp_new_i64(tcg_ctx_00);
  ret_01 = tcg_temp_new_i64(tcg_ctx_00);
  retv = tcg_temp_new_i64(tcg_ctx_00);
  t = tcg_temp_new_i64(tcg_ctx_00);
  t_00 = tcg_temp_new_i64(tcg_ctx_00);
  l = gen_new_label_mips64el(tcg_ctx_00);
  l_00 = gen_new_label_mips64el(tcg_ctx_00);
  gen_base_offset_addr(ctx,addr,base,(int)offset);
  tcg_gen_ld_i64_mips64el(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,0x780);
  tcg_gen_brcond_i64_mips64el(tcg_ctx_00,TCG_COND_NE,addr,ret,l);
  gen_load_gpr(tcg_ctx_00,t,reg1);
  gen_load_gpr(tcg_ctx_00,t_00,reg2);
  tcg_gen_concat32_i64(tcg_ctx_00,ret_00,t,t_00);
  tcg_gen_ld_i64_mips64el(tcg_ctx_00,ret_01,tcg_ctx_00->cpu_env,0x790);
  if (eva) {
    local_a4 = 2;
  }
  else {
    local_a4 = ctx->mem_idx;
  }
  tcg_gen_atomic_cmpxchg_i64_mips64el(tcg_ctx_00,retv,addr,ret_01,ret_00,(long)local_a4,MO_64);
  if (reg1 != 0) {
    tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[reg1],1);
  }
  tcg_gen_brcond_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,retv,ret_01,l_00);
  gen_set_label(tcg_ctx_00,l);
  if (reg1 != 0) {
    tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[reg1],0);
  }
  gen_set_label(tcg_ctx_00,l_00);
  tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret,-1);
  tcg_gen_st_i64_mips64el(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,0x780);
  return;
}

Assistant:

static void gen_scwp(DisasContext *ctx, uint32_t base, int16_t offset,
                    uint32_t reg1, uint32_t reg2, bool eva)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv taddr = tcg_temp_local_new(tcg_ctx);
    TCGv lladdr = tcg_temp_local_new(tcg_ctx);
    TCGv_i64 tval = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 llval = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 val = tcg_temp_new_i64(tcg_ctx);
    TCGv tmp1 = tcg_temp_new(tcg_ctx);
    TCGv tmp2 = tcg_temp_new(tcg_ctx);
    TCGLabel *lab_fail = gen_new_label(tcg_ctx);
    TCGLabel *lab_done = gen_new_label(tcg_ctx);

    gen_base_offset_addr(ctx, taddr, base, offset);

    tcg_gen_ld_tl(tcg_ctx, lladdr, tcg_ctx->cpu_env, offsetof(CPUMIPSState, lladdr));
    tcg_gen_brcond_tl(tcg_ctx, TCG_COND_NE, taddr, lladdr, lab_fail);

    gen_load_gpr(tcg_ctx, tmp1, reg1);
    gen_load_gpr(tcg_ctx, tmp2, reg2);

#ifdef TARGET_WORDS_BIGENDIAN
    tcg_gen_concat_tl_i64(tcg_ctx, tval, tmp2, tmp1);
#else
    tcg_gen_concat_tl_i64(tcg_ctx, tval, tmp1, tmp2);
#endif

    tcg_gen_ld_i64(tcg_ctx, llval, tcg_ctx->cpu_env, offsetof(CPUMIPSState, llval_wp));
    tcg_gen_atomic_cmpxchg_i64(tcg_ctx, val, taddr, llval, tval,
                               eva ? MIPS_HFLAG_UM : ctx->mem_idx, MO_64);
    if (reg1 != 0) {
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg1], 1);
    }
    tcg_gen_brcond_i64(tcg_ctx, TCG_COND_EQ, val, llval, lab_done);

    gen_set_label(tcg_ctx, lab_fail);

    if (reg1 != 0) {
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg1], 0);
    }
    gen_set_label(tcg_ctx, lab_done);
    tcg_gen_movi_tl(tcg_ctx, lladdr, -1);
    tcg_gen_st_tl(tcg_ctx, lladdr, tcg_ctx->cpu_env, offsetof(CPUMIPSState, lladdr));
}